

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O2

int csp_zmqhub_init_w_endpoints
              (uint16_t addr,char *publisher_endpoint,char *subscriber_endpoint,uint32_t flags,
              csp_iface_t **return_interface)

{
  uint32_t in_stack_ffffffffffffffe8;
  
  csp_zmqhub_init_w_name_endpoints_rxfilter
            ((char *)0x0,addr,(uint16_t *)subscriber_endpoint,flags,publisher_endpoint,
             subscriber_endpoint,in_stack_ffffffffffffffe8,return_interface);
  return 0;
}

Assistant:

int csp_zmqhub_init_w_endpoints(uint16_t addr,
								const char * publisher_endpoint,
								const char * subscriber_endpoint,
								uint32_t flags,
								csp_iface_t ** return_interface) {

	uint16_t * rxfilter = NULL;
	unsigned int rxfilter_count = 0;

	return csp_zmqhub_init_w_name_endpoints_rxfilter(NULL, addr,
													 rxfilter, rxfilter_count,
													 publisher_endpoint,
													 subscriber_endpoint,
													 flags,
													 return_interface);
}